

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFParallelForC.H
# Opt level: O0

enable_if_t<IsFabArray<MultiFab>::value>
amrex::experimental::detail::
ParallelFor<amrex::MultiFab,amrex::STLtools::fill(amrex::MultiFab&,amrex::IntVect_const&,amrex::Geometry_const&,double,double)const::__0>
          (MultiFab *mf,IntVect *nghost,IntVect *ts,bool dynamic,anon_class_160_10_76ce0008 *f)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  MFItInfo *this;
  undefined1 in_CL;
  anon_class_160_10_76ce0008 *in_RDX;
  MFItInfo *in_RDI;
  undefined8 in_R8;
  int i;
  int j;
  int k;
  Dim3 hi;
  Dim3 lo;
  int lidx;
  Box *bx;
  MFIter mfi;
  MFIter *in_stack_fffffffffffffe30;
  int local_1b4;
  undefined4 in_stack_fffffffffffffe50;
  int iVar5;
  undefined4 in_stack_fffffffffffffe54;
  FabArrayBase *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  undefined1 local_164 [40];
  MFItInfo local_13c;
  MFIter local_128;
  int in_stack_ffffffffffffff40;
  undefined3 in_stack_ffffffffffffff44;
  uint box_no;
  
  box_no = CONCAT13(in_CL,in_stack_ffffffffffffff44) & 0x1ffffff;
  MFItInfo::MFItInfo(in_RDI);
  this = MFItInfo::EnableTiling(&local_13c,(IntVect *)in_RDX);
  MFItInfo::SetDynamic(this,(bool)((byte)(box_no >> 0x18) & 1));
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe58,
                 (MFItInfo *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  while (bVar3 = MFIter::isValid(&local_128), bVar3) {
    in_stack_fffffffffffffe30 = (MFIter *)local_164;
    MFIter::growntilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (IntVect *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_164._28_8_ = in_stack_fffffffffffffe30;
    MFIter::LocalIndex(in_stack_fffffffffffffe30);
    iVar1 = *(int *)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *
                       )local_164._28_8_)->_M_t).
                     super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    iVar2 = *(int *)((long)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               *)local_164._28_8_)->_M_t).
                            super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                            .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl + 4);
    in_stack_fffffffffffffe6c = *(int *)((long)(local_164._28_8_ + 8) + 4);
    in_stack_fffffffffffffe70 = ((IntVect *)(local_164._28_8_ + 0x10))->vect[0];
    in_stack_fffffffffffffe74 = ((IntVect *)(local_164._28_8_ + 0x10))->vect[1];
    for (iVar4 = *(int *)(local_164._28_8_ + 8); iVar5 = iVar2, iVar4 <= in_stack_fffffffffffffe74;
        iVar4 = iVar4 + 1) {
      for (; local_1b4 = iVar1, iVar5 <= in_stack_fffffffffffffe70; iVar5 = iVar5 + 1) {
        for (; local_1b4 <= in_stack_fffffffffffffe6c; local_1b4 = local_1b4 + 1) {
          STLtools::fill::anon_class_160_10_76ce0008::operator()
                    (in_RDX,box_no,in_stack_ffffffffffffff40,(int)((ulong)in_R8 >> 0x20),(int)in_R8)
          ;
        }
      }
    }
    MFIter::operator++(&local_128);
  }
  MFIter::~MFIter(in_stack_fffffffffffffe30);
  return;
}

Assistant:

std::enable_if_t<IsFabArray<MF>::value>
ParallelFor (MF const& mf, IntVect const& nghost, IntVect const& ts, bool dynamic, F&& f)
{
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter mfi(mf,MFItInfo().EnableTiling(ts).SetDynamic(dynamic)); mfi.isValid(); ++mfi) {
        Box const& bx = mfi.growntilebox(nghost);
        int const lidx = mfi.LocalIndex();
        const auto lo = amrex::lbound(bx);
        const auto hi = amrex::ubound(bx);
        for (        int k = lo.z; k <= hi.z; ++k) {
            for (    int j = lo.y; j <= hi.y; ++j) {
                AMREX_PRAGMA_SIMD
                for (int i = lo.x; i <= hi.x; ++i) {
                    f(lidx,i,j,k);
                }
            }
        }
    }
}